

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcDisassembler.c
# Opt level: O0

_Bool Sparc_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *info)

{
  DecodeStatus DVar1;
  long in_RCX;
  size_t in_RDX;
  uint8_t *in_RSI;
  undefined2 *in_R8;
  DecodeStatus Result;
  uint32_t Insn;
  uint32_t local_3c [3];
  undefined2 *local_30;
  long local_28;
  _Bool local_1;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  DVar1 = readInstruction32(in_RSI,in_RDX,local_3c);
  if (DVar1 == MCDisassembler_Fail) {
    local_1 = false;
  }
  else {
    if (*(long *)(*(long *)(local_28 + 0x310) + 0xf0) != 0) {
      memset(*(void **)(*(long *)(local_28 + 0x310) + 0xf0),0,0xa8);
    }
    DVar1 = decodeInstruction_4((uint8_t *)ud,(MCInst *)code,code_len._4_4_,(uint64_t)MI,
                                (MCRegisterInfo *)size,address._4_4_);
    if (DVar1 == MCDisassembler_Fail) {
      local_1 = false;
    }
    else {
      *local_30 = 4;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool Sparc_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *MI,
		uint16_t *size, uint64_t address, void *info)
{
	uint32_t Insn;
	DecodeStatus Result;
	
	Result = readInstruction32(code, code_len, &Insn);
	if (Result == MCDisassembler_Fail)
		return false;

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, offsetof(cs_detail, sparc)+sizeof(cs_sparc));
	}

	Result = decodeInstruction_4(DecoderTableSparc32, MI, Insn, address,
			(MCRegisterInfo *)info, 0);
	if (Result != MCDisassembler_Fail) {
		*size = 4;
		return true;
	}

	return false;
}